

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

void Ses_StoreWrite(Ses_Store_t *pStore,char *pFilename,int fSynthImp,int fSynthRL,int fUnsynthImp,
                   int fUnsynthRL)

{
  char *pcVar1;
  FILE *__s;
  long lVar2;
  Ses_TimesEntry_t *__ptr;
  Ses_TruthEntry_t *__ptr_00;
  unsigned_long nEntries;
  unsigned_long local_38;
  
  local_38 = 0;
  __s = fopen(pFilename,"wb");
  if (__s == (FILE *)0x0) {
    printf("cannot open file \"%s\" for writing\n",pFilename);
    return;
  }
  local_38 = pStore->nSynthesizedImp;
  fwrite(&local_38,8,1,__s);
  lVar2 = 0;
  do {
    for (__ptr_00 = pStore->pEntries[lVar2]; __ptr_00 != (Ses_TruthEntry_t *)0x0;
        __ptr_00 = __ptr_00->next) {
      __ptr = __ptr_00->head;
      if (__ptr != (Ses_TimesEntry_t *)0x0) {
        do {
          pcVar1 = __ptr->pNetwork;
          if (pcVar1 == (char *)0x0) {
LAB_002b99c8:
            if ((__ptr->fResLimit != 0) && ((pcVar1 != (char *)0x0 || (__ptr->fResLimit == 0)))) {
LAB_002b99dd:
              fwrite(__ptr_00,8,4,__s);
              fwrite(&__ptr_00->nVars,4,1,__s);
              fwrite(__ptr,4,8,__s);
              fwrite(&__ptr->fResLimit,4,1,__s);
              pcVar1 = __ptr->pNetwork;
              if (pcVar1 == (char *)0x0) {
                fputc(0,__s);
                fputc(0,__s);
                fputc(0,__s);
              }
              else {
                fwrite(pcVar1,1,(long)*pcVar1 + (long)pcVar1[2] * 4 + 5,__s);
              }
            }
          }
          else if (__ptr->fResLimit == 0) {
            if (pcVar1 == (char *)0x0) goto LAB_002b99c8;
            goto LAB_002b99dd;
          }
          __ptr = __ptr->next;
        } while (__ptr != (Ses_TimesEntry_t *)0x0);
      }
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x400) {
      fclose(__s);
      return;
    }
  } while( true );
}

Assistant:

static void Ses_StoreWrite( Ses_Store_t * pStore, const char * pFilename, int fSynthImp, int fSynthRL, int fUnsynthImp, int fUnsynthRL )
{
    int i;
    char zero = '\0';
    unsigned long nEntries = 0;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;
    FILE * pFile;

    pFile = fopen( pFilename, "wb" );
    if (pFile == NULL)
    {
        printf( "cannot open file \"%s\" for writing\n", pFilename );
        return;
    }

    if ( fSynthImp )   nEntries += pStore->nSynthesizedImp;
    if ( fSynthRL )    nEntries += pStore->nSynthesizedRL;
    if ( fUnsynthImp ) nEntries += pStore->nUnsynthesizedImp;
    if ( fUnsynthRL )  nEntries += pStore->nUnsynthesizedRL;
    fwrite( &nEntries, sizeof( unsigned long ), 1, pFile );

    for ( i = 0; i < SES_STORE_TABLE_SIZE; ++i )
        if ( pStore->pEntries[i] )
        {
            pTEntry = pStore->pEntries[i];

            while ( pTEntry )
            {
                pTiEntry = pTEntry->head;
                while ( pTiEntry )
                {
                    if ( !fSynthImp && pTiEntry->pNetwork && !pTiEntry->fResLimit )    { pTiEntry = pTiEntry->next; continue; }
                    if ( !fSynthRL && pTiEntry->pNetwork && pTiEntry->fResLimit )      { pTiEntry = pTiEntry->next; continue; }
                    if ( !fUnsynthImp && !pTiEntry->pNetwork && !pTiEntry->fResLimit ) { pTiEntry = pTiEntry->next; continue; }
                    if ( !fUnsynthRL && !pTiEntry->pNetwork && pTiEntry->fResLimit )   { pTiEntry = pTiEntry->next; continue; }

                    fwrite( pTEntry->pTruth, sizeof( word ), 4, pFile );
                    fwrite( &pTEntry->nVars, sizeof( int ), 1, pFile );
                    fwrite( pTiEntry->pArrTimeProfile, sizeof( int ), 8, pFile );
                    fwrite( &pTiEntry->fResLimit, sizeof( int ), 1, pFile );

                    if ( pTiEntry->pNetwork )
                    {
                        fwrite( pTiEntry->pNetwork, sizeof( char ), 3 + 4 * pTiEntry->pNetwork[ABC_EXACT_SOL_NGATES] + 2 + pTiEntry->pNetwork[ABC_EXACT_SOL_NVARS], pFile );
                    }
                    else
                    {
                        fwrite( &zero, sizeof( char ), 1, pFile );
                        fwrite( &zero, sizeof( char ), 1, pFile );
                        fwrite( &zero, sizeof( char ), 1, pFile );
                    }

                    pTiEntry = pTiEntry->next;
                }
                pTEntry = pTEntry->next;
            }
        }


    fclose( pFile );
}